

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPML_DIGEST_Unmarshal(TPML_DIGEST *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT32 UVar2;
  TPM_RC TVar3;
  ulong uVar4;
  TPM2B_DIGEST *target_00;
  
  iVar1 = *size;
  *size = iVar1 + -4;
  TVar3 = 0x9a;
  if (3 < iVar1) {
    UVar2 = ByteArrayToUint32(*buffer);
    target->count = UVar2;
    *buffer = *buffer + 4;
    TVar3 = 0x95;
    if (0xfffffff8 < UVar2 - 9) {
      target_00 = target->digests;
      uVar4 = (ulong)UVar2;
      do {
        TVar3 = TPM2B_DIGEST_Unmarshal(target_00,buffer,size);
        if (TVar3 != 0) {
          return TVar3;
        }
        target_00 = target_00 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      TVar3 = 0;
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPML_DIGEST_Unmarshal(TPML_DIGEST *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT32_Unmarshal((UINT32 *)&(target->count), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    if( (target->count < 2))
        return TPM_RC_SIZE;
    if((target->count) > 8)
        return TPM_RC_SIZE;
    result = TPM2B_DIGEST_Array_Unmarshal((TPM2B_DIGEST *)(target->digests), buffer, size, (INT32)(target->count));
    return result;
}